

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.c
# Opt level: O0

int lyd_print_clb(_func_ssize_t_void_ptr_void_ptr_size_t *writeclb,void *arg,lyd_node *root,
                 LYD_FORMAT format,int options)

{
  undefined1 local_78 [8];
  lyout out;
  int r;
  int options_local;
  LYD_FORMAT format_local;
  lyd_node *root_local;
  void *arg_local;
  _func_ssize_t_void_ptr_void_ptr_size_t *writeclb_local;
  
  if (writeclb == (_func_ssize_t_void_ptr_void_ptr_size_t *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lyd_print_clb");
    writeclb_local._4_4_ = 1;
  }
  else {
    memset(local_78,0,0x40);
    local_78._0_4_ = LYOUT_CALLBACK;
    out._0_8_ = writeclb;
    out.method.f = (FILE *)arg;
    out.hole_count._4_4_ = lyd_print_((lyout *)local_78,root,format,options);
    free((void *)out.method.mem.size);
    writeclb_local._4_4_ = out.hole_count._4_4_;
  }
  return writeclb_local._4_4_;
}

Assistant:

API int
lyd_print_clb(ssize_t (*writeclb)(void *arg, const void *buf, size_t count), void *arg, const struct lyd_node *root,
              LYD_FORMAT format, int options)
{
    int r;
    struct lyout out;

    if (!writeclb) {
        LOGARG;
        return EXIT_FAILURE;
    }

    memset(&out, 0, sizeof out);

    out.type = LYOUT_CALLBACK;
    out.method.clb.f = writeclb;
    out.method.clb.arg = arg;

    r = lyd_print_(&out, root, format, options);

    free(out.buffered);
    return r;
}